

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O0

int per_ext(double *sig,int len,int a,double *oup)

{
  double dVar1;
  double temp2;
  double temp1;
  int len2;
  int i;
  double *oup_local;
  int a_local;
  int len_local;
  double *sig_local;
  
  for (temp1._4_4_ = 0; temp1._4_4_ < len; temp1._4_4_ = temp1._4_4_ + 1) {
    oup[a + temp1._4_4_] = sig[temp1._4_4_];
  }
  temp1._0_4_ = len;
  if (len % 2 != 0) {
    temp1._0_4_ = len + 1;
    oup[a + len] = sig[len + -1];
  }
  for (temp1._4_4_ = 0; temp1._4_4_ < a; temp1._4_4_ = temp1._4_4_ + 1) {
    dVar1 = oup[a + temp1._4_4_];
    oup[(a + -1) - temp1._4_4_] = oup[(a + temp1._0_4_ + -1) - temp1._4_4_];
    oup[temp1._0_4_ + a + temp1._4_4_] = dVar1;
  }
  return temp1._0_4_;
}

Assistant:

int per_ext(double *sig, int len, int a, double *oup) {
	int i, len2;
	double temp1;
	double temp2;
	for (i = 0; i < len; ++i) {
		oup[a + i] = sig[i];
	}
	len2 = len;
	if ((len % 2) != 0) {
		len2 = len + 1;
		oup[a + len] = sig[len - 1];
	}
	for (i = 0; i < a; ++i) {
		temp1 = oup[a + i];
		temp2 = oup[a + len2 - 1 - i];
		oup[a - 1 - i] = temp2;
		oup[len2 + a + i] = temp1;
	}
	return len2;
}